

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

pair<bool,_const_char_*> consistentProperty<char_const*>(char *lhs,char *rhs,CompatibleType t)

{
  undefined8 in_RAX;
  char *pcVar1;
  pair<bool,_const_char_*> pVar2;
  
  pVar2._1_7_ = (undefined7)((ulong)in_RAX >> 8);
  pVar2.first = true;
  if (lhs == (char *)0x0 && rhs == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = rhs;
    if ((lhs != (char *)0x0) && (pcVar1 = lhs, rhs != (char *)0x0)) {
      if (t - NumberMinType < 2) {
        pVar2 = consistentNumberProperty(lhs,rhs,t);
        return pVar2;
      }
      if (t != StringType) {
        if (t != BoolType) {
          __assert_fail("false && \"Unreachable!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                        ,0xf4b,
                        "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                       );
        }
        __assert_fail("false && \"consistentProperty for strings called with BoolType\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                      ,0xf43,
                      "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                     );
      }
      pVar2 = consistentStringProperty(lhs,rhs);
      return pVar2;
    }
  }
  pVar2.second = pcVar1;
  return pVar2;
}

Assistant:

std::pair<bool, const char*> consistentProperty(const char* lhs,
                                                const char* rhs,
                                                CompatibleType t)
{
  if (!lhs && !rhs) {
    return std::make_pair(true, lhs);
  }
  if (!lhs) {
    return std::make_pair(true, rhs);
  }
  if (!rhs) {
    return std::make_pair(true, lhs);
  }

  const char* const null_ptr = CM_NULLPTR;

  switch (t) {
    case BoolType:
      assert(false && "consistentProperty for strings called with BoolType");
      return std::pair<bool, const char*>(false, null_ptr);
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType:
      return consistentNumberProperty(lhs, rhs, t);
  }
  assert(false && "Unreachable!");
  return std::pair<bool, const char*>(false, null_ptr);
}